

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.cc
# Opt level: O3

void __thiscall FIX::double_conversion::Bignum::MultiplyByUInt32(Bignum *this,uint32_t factor)

{
  uint *puVar1;
  bool bVar2;
  ulong uVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  int i;
  long lVar7;
  ulong uVar8;
  
  if (factor != 1) {
    if (factor == 0) {
      Zero(this);
      return;
    }
    if (0 < this->used_digits_) {
      puVar1 = (this->bigits_).start_;
      lVar7 = 0;
      uVar3 = 0;
      do {
        if ((this->bigits_).length_ <= lVar7) goto LAB_0016b101;
        uVar8 = (ulong)puVar1[lVar7] * (ulong)factor + uVar3;
        puVar1[lVar7] = (uint)uVar8 & 0xfffffff;
        uVar3 = uVar8 >> 0x1c;
        lVar7 = lVar7 + 1;
        uVar6 = (ulong)this->used_digits_;
      } while (lVar7 < (long)uVar6);
      if (0xfffffff < uVar8) {
        puVar1 = (this->bigits_).start_;
        do {
          iVar4 = (int)uVar6;
          if (0x7f < iVar4) {
            abort();
          }
          if ((iVar4 < 0) || ((this->bigits_).length_ <= iVar4)) {
LAB_0016b101:
            __assert_fail("0 <= index && index < length_",
                          "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/double-conversion/utils.h"
                          ,0xcc,
                          "T &FIX::double_conversion::Vector<unsigned int>::operator[](int) const [T = unsigned int]"
                         );
          }
          puVar1[uVar6 & 0xffffffff] = (uint)uVar3 & 0xfffffff;
          uVar5 = this->used_digits_ + 1;
          uVar6 = (ulong)uVar5;
          this->used_digits_ = uVar5;
          bVar2 = 0xfffffff < uVar3;
          uVar3 = uVar3 >> 0x1c;
        } while (bVar2);
      }
    }
  }
  return;
}

Assistant:

void Bignum::MultiplyByUInt32(uint32_t factor) {
  if (factor == 1) return;
  if (factor == 0) {
    Zero();
    return;
  }
  if (used_digits_ == 0) return;

  // The product of a bigit with the factor is of size kBigitSize + 32.
  // Assert that this number + 1 (for the carry) fits into double chunk.
  ASSERT(kDoubleChunkSize >= kBigitSize + 32 + 1);
  DoubleChunk carry = 0;
  for (int i = 0; i < used_digits_; ++i) {
    DoubleChunk product = static_cast<DoubleChunk>(factor) * bigits_[i] + carry;
    bigits_[i] = static_cast<Chunk>(product & kBigitMask);
    carry = (product >> kBigitSize);
  }
  while (carry != 0) {
    EnsureCapacity(used_digits_ + 1);
    bigits_[used_digits_] = carry & kBigitMask;
    used_digits_++;
    carry >>= kBigitSize;
  }
}